

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# igsc_cli.c
# Opt level: O2

int do_list_devices(int argc,char **argv)

{
  long lVar1;
  _Bool _Var2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  FILE *__s;
  char *pcVar7;
  long in_FS_OFFSET;
  bool bVar8;
  size_t sStack_180;
  igsc_device_handle handle;
  igsc_device_iterator *iter;
  igsc_fw_version fw_version;
  igsc_oprom_version oprom_version;
  igsc_device_info info;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  handle.ctx = (igsc_lib_ctx *)0x0;
  fw_version.project[0] = '\0';
  fw_version.project[1] = '\0';
  fw_version.project[2] = '\0';
  fw_version.project[3] = '\0';
  fw_version.hotfix = 0;
  fw_version.build = 0;
  oprom_version.version[0] = '\0';
  oprom_version.version[1] = '\0';
  oprom_version.version[2] = '\0';
  oprom_version.version[3] = '\0';
  oprom_version.version[4] = '\0';
  oprom_version.version[5] = '\0';
  oprom_version.version[6] = '\0';
  oprom_version.version[7] = '\0';
  bVar8 = argc == 0;
  if (0 < argc) {
    pcVar7 = *argv;
    _Var2 = arg_is_token(pcVar7,"-i");
    if ((!_Var2) && (_Var2 = arg_is_token(pcVar7,"--info"), !_Var2)) {
      uVar4 = 0xffffffff;
      if (quiet == '\0') {
        fprintf(_stderr,"Error: Wrong argument: %s\n",pcVar7);
      }
      goto LAB_00106ed8;
    }
    bVar8 = argc == 1;
  }
  if (bVar8) {
    uVar3 = igsc_device_iterator_create(&iter);
    if (uVar3 != 0) {
      uVar4 = 1;
      if (quiet == '\0') {
        fprintf(_stderr,"Error: Cannot create device iterator %d\n",(ulong)uVar3);
      }
      goto LAB_00106ed8;
    }
    info.name[0] = '\0';
    uVar3 = 0;
    while (uVar4 = igsc_device_iterator_next(iter,&info), uVar4 == 0) {
      iVar5 = igsc_device_init_by_device_info(&handle,&info);
      if (iVar5 == 0) {
        igsc_device_update_device_info(&handle,&info);
        uVar3 = uVar3 + 1;
        printf("Device [%d] \'%s\': %04hx:%04hx %04hx:%04hx %04hu:%02x:%02x.%02x\n",(ulong)uVar3,
               &info,(ulong)info.vendor_id,(ulong)info.device_id,(ulong)info.subsys_vendor_id,
               (ulong)info.subsys_device_id,(ulong)info.domain,(ulong)info.bus,(ulong)info.dev,
               (ulong)info.func);
        if (0 < argc) {
          iVar5 = 3;
          do {
            iVar6 = igsc_device_fw_version(&handle,&fw_version);
            if (iVar6 != 0xd) {
              if (iVar6 == 0) {
                print_fw_version("",&fw_version);
              }
              break;
            }
            usleep(2000000);
            iVar5 = iVar5 + -1;
          } while (iVar5 != 0);
          iVar5 = 3;
          do {
            iVar6 = igsc_device_oprom_version(&handle,2,&oprom_version);
            if (iVar6 != 0xd) {
              if (iVar6 == 0) {
                print_oprom_version(IGSC_OPROM_CODE,&oprom_version);
              }
              break;
            }
            usleep(2000000);
            iVar5 = iVar5 + -1;
          } while (iVar5 != 0);
          iVar5 = 3;
          do {
            iVar6 = igsc_device_oprom_version(&handle,1,&oprom_version);
            if (iVar6 != 0xd) {
              if (iVar6 == 0) {
                print_oprom_version(IGSC_OPROM_DATA,&oprom_version);
              }
              break;
            }
            usleep(2000000);
            iVar5 = iVar5 + -1;
          } while (iVar5 != 0);
        }
        info.name[0] = '\0';
        igsc_device_close(&handle);
      }
      else {
        info.name[0] = '\0';
      }
    }
    if (uVar4 == 4) {
      uVar4 = 0;
    }
    else if (quiet == '\0') {
      fprintf(_stderr,"Error: Failure in the device iterator: %d\n",(ulong)uVar4);
    }
    igsc_device_iterator_destroy(iter);
    if ((uVar3 != 0) || (quiet != '\0')) goto LAB_00106ed8;
    pcVar7 = "No device found\n";
    sStack_180 = 0x10;
    __s = _stdout;
  }
  else {
    uVar4 = 0xffffffff;
    if ((verbose != '\x01') || (quiet != '\0')) goto LAB_00106ed8;
    pcVar7 = "Too many arguments\n";
    sStack_180 = 0x13;
    __s = _stderr;
  }
  fwrite(pcVar7,sStack_180,1,__s);
LAB_00106ed8:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return uVar4;
}

Assistant:

static int do_list_devices(int argc, char *argv[])
{
    struct igsc_device_iterator *iter;
    struct igsc_device_info info;
    int ret;
    struct igsc_device_handle handle;
    struct igsc_fw_version fw_version;
    struct igsc_oprom_version oprom_version;
    bool do_info = false;
    unsigned int ndevices = 0;
    unsigned int retries;

    memset(&handle, 0, sizeof(handle));
    memset(&fw_version, 0, sizeof(fw_version));
    memset(&oprom_version, 0, sizeof(oprom_version));

    if (argc >= 1)
    {
        if (arg_is_info(argv[0]))
        {
            do_info = true;
        }
        else
        {
            fwupd_error("Wrong argument: %s\n", argv[0]);
            return ERROR_BAD_ARGUMENT;
        }
    }

    /* Should be no more args */
    if (arg_next(&argc, &argv))
    {
        fwupd_verbose("Too many arguments\n");
        return ERROR_BAD_ARGUMENT;
    }

    ret = igsc_device_iterator_create(&iter);
    if (ret != IGSC_SUCCESS)
    {
        fwupd_error("Cannot create device iterator %d\n", ret);
        return EXIT_FAILURE;
    }

    info.name[0] = '\0';
    while ((ret = igsc_device_iterator_next(iter, &info)) == IGSC_SUCCESS)
    {

        ret = igsc_device_init_by_device_info(&handle, &info);
        if (ret != IGSC_SUCCESS)
        {
            /* make sure we have a printable name */
            info.name[0] = '\0';
            continue;
        }

        igsc_device_update_device_info(&handle, &info);

        ndevices++;

        printf("Device [%d] '%s': %04hx:%04hx %04hx:%04hx %04hu:%02x:%02x.%02x\n",
               ndevices,
               info.name,
               info.vendor_id, info.device_id,
               info.subsys_vendor_id, info.subsys_device_id,
               info.domain, info.bus, info.dev, info.func);

        if (do_info)
        {
            retries = 0;
            while ((ret = igsc_device_fw_version(&handle, &fw_version)) == IGSC_ERROR_BUSY)
            {
               gsc_msleep(CONNECT_RETRIES_SLEEP_MSEC);
               if (++retries >= MAX_CONNECT_RETRIES)
                  break;
            }
            if (ret == IGSC_SUCCESS)
            {
                print_fw_version("", &fw_version);
            }
            retries = 0;
            while ((ret = igsc_device_oprom_version(&handle, IGSC_OPROM_CODE, &oprom_version)) == IGSC_ERROR_BUSY)
            {
               gsc_msleep(CONNECT_RETRIES_SLEEP_MSEC);
               if (++retries >= MAX_CONNECT_RETRIES)
                  break;
            }
            if (ret == IGSC_SUCCESS)
            {
                print_oprom_code_version(&oprom_version);
            }
            retries = 0;
            while ((ret = igsc_device_oprom_version(&handle, IGSC_OPROM_DATA, &oprom_version))  == IGSC_ERROR_BUSY)
            {
               gsc_msleep(CONNECT_RETRIES_SLEEP_MSEC);
               if (++retries >= MAX_CONNECT_RETRIES)
                  break;
            }
            if (ret == IGSC_SUCCESS)
            {
                print_oprom_data_version(&oprom_version);
            }
        }
        /* make sure we have a printable name */
        info.name[0] = '\0';
        (void)igsc_device_close(&handle);
    }
    if (ret == IGSC_ERROR_DEVICE_NOT_FOUND)
    {
        ret = EXIT_SUCCESS;
    }
    else
    {
        fwupd_error("Failure in the device iterator: %d\n", ret);
    }
    igsc_device_iterator_destroy(iter);

    if (ndevices == 0)
    {
        fwupd_msg("No device found\n");
    }

    return ret;
}